

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall kj::anon_unknown_77::AsyncTee::ensurePulling(AsyncTee *this)

{
  UnwindDetector unwind;
  undefined1 local_40 [32];
  AsyncTee *local_20;
  bool local_18;
  
  if (this->pulling == false) {
    this->pulling = true;
    UnwindDetector::UnwindDetector((UnwindDetector *)(local_40 + 0x14));
    local_18 = false;
    local_40._24_8_ = (AsyncInputStream *)(local_40 + 0x14);
    local_20 = this;
    pull((AsyncTee *)local_40);
    Own<kj::_::PromiseNode>::operator=
              ((Own<kj::_::PromiseNode> *)&this->pullPromise,(Own<kj::_::PromiseNode> *)local_40);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_40);
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1560:7)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_c__:1560:7)>
                 *)(local_40 + 0x18));
  }
  return;
}

Assistant:

void ensurePulling() {
    if (!pulling) {
      pulling = true;
      UnwindDetector unwind;
      KJ_DEFER(if (unwind.isUnwinding()) pulling = false);
      pullPromise = pull();
    }
  }